

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void rd_pick_skip_mode(RD_STATS *rd_cost,InterModeSearchState *search_state,AV1_COMP *cpi,
                      MACROBLOCK *x,BLOCK_SIZE bsize,buf_2d (*yv12_mb) [3])

{
  char ref_frame_00;
  char second_ref_frame_00;
  THR_MODES TVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  AV1_COMMON *cm_00;
  MACROBLOCKD *xd_00;
  int16_t *in_RCX;
  long lVar5;
  int_mv (*paiVar6) [2];
  long in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  undefined1 in_R8B;
  int_mv (*in_R9) [2];
  ModeCosts *mode_costs;
  int64_t best_intra_inter_mode_cost;
  int skip_mode_ctx;
  int i_1;
  BUFFER_SET orig_dst;
  int i;
  MB_MODE_INFO_EXT *mbmi_ext;
  uint8_t ref_frame_type;
  THR_MODES mode_index;
  PREDICTION_MODE this_mode;
  MV_REFERENCE_FRAME second_ref_frame;
  MV_REFERENCE_FRAME ref_frame;
  RD_STATS skip_mode_rd_stats;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  SkipModeInfo *skip_mode_info;
  AV1_COMMON *cm;
  RD_STATS *in_stack_fffffffffffffee8;
  MACROBLOCKD *in_stack_fffffffffffffef0;
  int16_t *in_stack_fffffffffffffef8;
  int16_t *in_stack_ffffffffffffff00;
  MACROBLOCKD *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff1c;
  MACROBLOCK *in_stack_ffffffffffffff20;
  AV1_COMMON *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff34;
  PREDICTION_MODE this_mode_00;
  int iVar7;
  int_mv *in_stack_ffffffffffffff38;
  int aiStack_b0 [2];
  int64_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  MB_MODE_INFO_EXT *in_stack_ffffffffffffff68;
  BLOCK_SIZE bsize_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar8;
  undefined1 uVar9;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  RD_STATS *in_stack_ffffffffffffff80;
  undefined7 local_78;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff8f;
  MB_MODE_INFO *in_stack_ffffffffffffff90;
  MACROBLOCKD *in_stack_ffffffffffffff98;
  AV1_COMMON *cm_01;
  undefined7 in_stack_ffffffffffffffd0;
  int16_t *mode_context;
  
  this_mode_00 = (PREDICTION_MODE)((uint)in_stack_ffffffffffffff34 >> 0x18);
  cm_00 = (AV1_COMMON *)(in_RDX + 0x3bf80);
  iVar3 = av1_num_planes(cm_00);
  xd_00 = (MACROBLOCKD *)(in_RCX + 0xd0);
  cm_01 = (AV1_COMMON *)**(long **)(in_RCX + 0x102c);
  *(undefined1 *)(in_RCX + 0xe324) = 1;
  mode_context = in_RCX;
  av1_invalid_rd_stats((RD_STATS *)&stack0xffffffffffffff78);
  if ((*(int *)(in_RDX + 0x3bf9c) != -1) && (*(int *)(in_RDX + 0x3bfa0) != -1)) {
    ref_frame_00 = (char)*(undefined4 *)(in_RDX + 0x3bf9c) + '\x01';
    second_ref_frame_00 = (char)*(undefined4 *)(in_RDX + 0x3bfa0) + '\x01';
    uVar9 = 0x11;
    TVar1 = get_prediction_mode_idx('\x11',ref_frame_00,second_ref_frame_00);
    if ((TVar1 != 0xff) &&
       ((((*(byte *)(in_RDX + 0x426d9) & 1) != 0 && (*(int *)(in_RDX + 0x60adc) == 0)) ||
        (*(int *)(in_RDX + 0x71290) == 0)))) {
      (cm_01->current_frame).field_0x2 = 0x11;
      (cm_01->current_frame).field_0x3 = 0;
      *(char *)&(cm_01->current_frame).frame_number = ref_frame_00;
      *(char *)((long)&(cm_01->current_frame).frame_number + 1) = second_ref_frame_00;
      bVar2 = av1_ref_frame_type((MV_REFERENCE_FRAME *)in_stack_fffffffffffffee8);
      uVar8 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff70);
      if (*(char *)((long)mode_context + (ulong)bVar2 + 0x40f8) == -1) {
        in_stack_ffffffffffffff68 = (MB_MODE_INFO_EXT *)(mode_context + 0x1e38);
        if (*(char *)((long)mode_context + (long)ref_frame_00 + 0x40f8) == -1) {
          return;
        }
        if (*(char *)((long)mode_context + (long)second_ref_frame_00 + 0x40f8) == -1) {
          return;
        }
        in_stack_fffffffffffffee8 = (RD_STATS *)(in_RCX + 0x14ac);
        in_stack_fffffffffffffef8 = mode_context + 0x208c;
        in_stack_ffffffffffffff00 = mode_context + 0x209c;
        in_stack_fffffffffffffef0 = (MACROBLOCKD *)0x0;
        av1_find_mv_refs(cm_01,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8f,(uint8_t *)in_stack_ffffffffffffff80,
                         (CANDIDATE_MV (*) [8])
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (uint16_t (*) [8])cm_00,in_R9,
                         (int_mv *)CONCAT17(in_R8B,in_stack_ffffffffffffffd0),mode_context);
        av1_copy_usable_ref_mv_stack_and_weight
                  (xd_00,in_stack_ffffffffffffff68,(MV_REFERENCE_FRAME)((uint)uVar8 >> 0x18));
      }
      iVar4 = build_cur_mv(in_stack_ffffffffffffff38,this_mode_00,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      if (iVar4 != 0) {
        *(undefined1 *)((long)cm_01->buffer_removal_times + 7) = 0;
        *(undefined1 *)&cm_01->render_width = 0xff;
        *(ushort *)((long)cm_01->buffer_removal_times + 0x53) =
             *(ushort *)((long)cm_01->buffer_removal_times + 0x53) & 0xfeff;
        *(ushort *)((long)cm_01->buffer_removal_times + 0x53) =
             *(ushort *)((long)cm_01->buffer_removal_times + 0x53) & 0xfdff |
             (*(byte *)(mode_context + 0xe324) & 1) << 9;
        cm_01->field_0x53 = 0;
        *(undefined1 *)&(cm_01->current_frame).skip_mode_info.skip_mode_flag = 0;
        *(ushort *)((long)cm_01->buffer_removal_times + 0x53) =
             *(ushort *)((long)cm_01->buffer_removal_times + 0x53) & 0xffcf;
        *(undefined1 *)(cm_01->buffer_removal_times + 0xf) = 1;
        *(ushort *)((long)cm_01->buffer_removal_times + 0x53) =
             *(ushort *)((long)cm_01->buffer_removal_times + 0x53) & 0xffbf | 0x40;
        *(undefined1 *)((long)cm_01->buffer_removal_times + 0x3a) = 0;
        *(undefined1 *)((long)cm_01->buffer_removal_times + 0x3b) = 0;
        set_default_interp_filters
                  ((MB_MODE_INFO *)in_stack_fffffffffffffef0,
                   (InterpFilter)((ulong)in_stack_fffffffffffffee8 >> 0x38));
        set_ref_ptrs((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,
                     (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                     (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff00 >> 0x30));
        for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
          lVar5 = (long)iVar4;
          paiVar6 = in_R9 + (long)(char)(cm_01->current_frame).frame_number * 0xc + (long)iVar4 * 4;
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0xf0) = *paiVar6;
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0xf4) = paiVar6[1];
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0xf8) = paiVar6[2];
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0xfc) = paiVar6[3];
          lVar5 = (long)iVar4;
          paiVar6 = in_R9 + (long)*(char *)((long)&(cm_01->current_frame).frame_number + 1) * 0xc +
                            (long)iVar4 * 4;
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0x100) = *paiVar6;
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0x104) = paiVar6[1];
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0x108) = paiVar6[2];
          *(int_mv (*) [2])(in_RCX + lVar5 * 0x518 + 0x10c) = paiVar6[3];
        }
        for (iVar7 = 0; bsize_00 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff68 >> 0x38),
            iVar7 < iVar3; iVar7 = iVar7 + 1) {
          *(uint8_t **)(&stack0xffffffffffffff38 + (long)iVar7 * 8) = xd_00->plane[iVar7].dst.buf;
          aiStack_b0[iVar7] = xd_00->plane[iVar7].dst.stride;
        }
        iVar3 = av1_get_skip_mode_context(xd_00);
        lVar5 = 0x7fffffffffffffff;
        if ((*(long *)(in_RDI + 2) < 0x7fffffffffffffff) && (*in_RDI < 0x7fffffff)) {
          lVar5 = ((long)(*in_RDI + *(int *)(mode_context + (long)iVar3 * 4 + 0x3f68)) *
                   (long)*(int *)(mode_context + 0x210c) + 0x100 >> 9) +
                  *(long *)(in_RDI + 2) * 0x80;
          *in_RDI = *(int *)(mode_context + (long)iVar3 * 4 + 0x3f68) + *in_RDI;
          av1_rd_cost_update((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                             in_stack_fffffffffffffee8);
        }
        skip_mode_rd(in_stack_ffffffffffffff80,
                     (AV1_COMP *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (MACROBLOCK *)
                     CONCAT17(ref_frame_00,
                              CONCAT16(second_ref_frame_00,CONCAT15(uVar9,CONCAT14(TVar1,uVar8)))),
                     bsize_00,(BUFFER_SET *)CONCAT44(iVar4,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
        if ((CONCAT17(in_stack_ffffffffffffff8f,local_78) <= lVar5) &&
           ((*(int *)(in_RCX + (ulong)((byte)*(undefined2 *)
                                              ((long)cm_01->buffer_removal_times + 0x53) & 7) * 2 +
                               0x15b2) == 0 || (in_stack_ffffffffffffff80 == (RD_STATS *)0x0)))) {
          *(ushort *)((long)in_RSI + 0xbf) = *(ushort *)((long)in_RSI + 0xbf) & 0xffbf | 0x40;
          memcpy(in_RSI + 3,cm_01,0xb0);
          memset((void *)((long)in_RSI + 0xaa),(uint)*(byte *)((long)in_RSI + 0xa9),0x10);
          if (*(char *)(in_RSI + 0x15) != '\0') {
            is_inter_block((MB_MODE_INFO *)in_stack_fffffffffffffef0);
          }
          set_txfm_ctxs((TX_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                        (int)in_stack_ffffffffffffff00,
                        (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                        (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          *(THR_MODES *)(in_RSI + 0x1b) = TVar1;
          *in_RDI = in_stack_ffffffffffffff78;
          *(RD_STATS **)(in_RDI + 6) = in_stack_ffffffffffffff80;
          *(RD_STATS **)(in_RDI + 2) = in_stack_ffffffffffffff80;
          *(ulong *)(in_RDI + 4) = CONCAT17(in_stack_ffffffffffffff8f,local_78);
          *in_RSI = *(undefined8 *)(in_RDI + 4);
          *(undefined4 *)((long)in_RSI + 0xd4) = 1;
          *(undefined4 *)(in_RSI + 0x1a) = 1;
          *(undefined1 *)(mode_context + 0x12704) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void rd_pick_skip_mode(
    RD_STATS *rd_cost, InterModeSearchState *search_state,
    const AV1_COMP *const cpi, MACROBLOCK *const x, BLOCK_SIZE bsize,
    struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE]) {
  const AV1_COMMON *const cm = &cpi->common;
  const SkipModeInfo *const skip_mode_info = &cm->current_frame.skip_mode_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];

  x->compound_idx = 1;  // COMPOUND_AVERAGE
  RD_STATS skip_mode_rd_stats;
  av1_invalid_rd_stats(&skip_mode_rd_stats);

  if (skip_mode_info->ref_frame_idx_0 == INVALID_IDX ||
      skip_mode_info->ref_frame_idx_1 == INVALID_IDX) {
    return;
  }

  const MV_REFERENCE_FRAME ref_frame =
      LAST_FRAME + skip_mode_info->ref_frame_idx_0;
  const MV_REFERENCE_FRAME second_ref_frame =
      LAST_FRAME + skip_mode_info->ref_frame_idx_1;
  const PREDICTION_MODE this_mode = NEAREST_NEARESTMV;
  const THR_MODES mode_index =
      get_prediction_mode_idx(this_mode, ref_frame, second_ref_frame);

  if (mode_index == THR_INVALID) {
    return;
  }

  if ((!cpi->oxcf.ref_frm_cfg.enable_onesided_comp ||
       cpi->sf.inter_sf.disable_onesided_comp) &&
      cpi->all_one_sided_refs) {
    return;
  }

  mbmi->mode = this_mode;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = ref_frame;
  mbmi->ref_frame[1] = second_ref_frame;
  const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
  if (x->mbmi_ext.ref_mv_count[ref_frame_type] == UINT8_MAX) {
    MB_MODE_INFO_EXT *mbmi_ext = &x->mbmi_ext;
    if (mbmi_ext->ref_mv_count[ref_frame] == UINT8_MAX ||
        mbmi_ext->ref_mv_count[second_ref_frame] == UINT8_MAX) {
      return;
    }
    av1_find_mv_refs(cm, xd, mbmi, ref_frame_type, mbmi_ext->ref_mv_count,
                     xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                     mbmi_ext->mode_context);
    // TODO(Ravi): Populate mbmi_ext->ref_mv_stack[ref_frame][4] and
    // mbmi_ext->weight[ref_frame][4] inside av1_find_mv_refs.
    av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame_type);
  }

  assert(this_mode == NEAREST_NEARESTMV);
  if (!build_cur_mv(mbmi->mv, this_mode, cm, x, 0)) {
    return;
  }

  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->interintra_mode = (INTERINTRA_MODE)(II_DC_PRED - 1);
  mbmi->comp_group_idx = 0;
  mbmi->compound_idx = x->compound_idx;
  mbmi->interinter_comp.type = COMPOUND_AVERAGE;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->ref_mv_idx = 0;
  mbmi->skip_mode = mbmi->skip_txfm = 1;
  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;

  set_default_interp_filters(mbmi, cm->features.interp_filter);

  set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
  for (int i = 0; i < num_planes; i++) {
    xd->plane[i].pre[0] = yv12_mb[mbmi->ref_frame[0]][i];
    xd->plane[i].pre[1] = yv12_mb[mbmi->ref_frame[1]][i];
  }

  BUFFER_SET orig_dst;
  for (int i = 0; i < num_planes; i++) {
    orig_dst.plane[i] = xd->plane[i].dst.buf;
    orig_dst.stride[i] = xd->plane[i].dst.stride;
  }

  // Compare the use of skip_mode with the best intra/inter mode obtained.
  const int skip_mode_ctx = av1_get_skip_mode_context(xd);
  int64_t best_intra_inter_mode_cost = INT64_MAX;
  if (rd_cost->dist < INT64_MAX && rd_cost->rate < INT32_MAX) {
    const ModeCosts *mode_costs = &x->mode_costs;
    best_intra_inter_mode_cost = RDCOST(
        x->rdmult, rd_cost->rate + mode_costs->skip_mode_cost[skip_mode_ctx][0],
        rd_cost->dist);
    // Account for non-skip mode rate in total rd stats
    rd_cost->rate += mode_costs->skip_mode_cost[skip_mode_ctx][0];
    av1_rd_cost_update(x->rdmult, rd_cost);
  }

  // Obtain the rdcost for skip_mode.
  skip_mode_rd(&skip_mode_rd_stats, cpi, x, bsize, &orig_dst,
               best_intra_inter_mode_cost);

  if (skip_mode_rd_stats.rdcost <= best_intra_inter_mode_cost &&
      (!xd->lossless[mbmi->segment_id] || skip_mode_rd_stats.dist == 0)) {
    assert(mode_index != THR_INVALID);
    search_state->best_mbmode.skip_mode = 1;
    search_state->best_mbmode = *mbmi;
    memset(search_state->best_mbmode.inter_tx_size,
           search_state->best_mbmode.tx_size,
           sizeof(search_state->best_mbmode.inter_tx_size));
    set_txfm_ctxs(search_state->best_mbmode.tx_size, xd->width, xd->height,
                  search_state->best_mbmode.skip_txfm && is_inter_block(mbmi),
                  xd);
    search_state->best_mode_index = mode_index;

    // Update rd_cost
    rd_cost->rate = skip_mode_rd_stats.rate;
    rd_cost->dist = rd_cost->sse = skip_mode_rd_stats.dist;
    rd_cost->rdcost = skip_mode_rd_stats.rdcost;

    search_state->best_rd = rd_cost->rdcost;
    search_state->best_skip2 = 1;
    search_state->best_mode_skippable = 1;

    x->txfm_search_info.skip_txfm = 1;
  }
}